

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O2

Value * __thiscall
soul::Value::createStruct
          (Value *__return_storage_ptr__,Value *this,Structure *s,ArrayView<soul::Value> members)

{
  ArrayView<soul::Value> values;
  PackedData local_50;
  Type local_38;
  
  local_38.category = structure;
  local_38.arrayElementCategory = invalid;
  local_38.isRef = false;
  local_38.isConstant = false;
  local_38.primitiveType.type = invalid;
  local_38.boundingSize._0_1_ = 0;
  local_38._9_7_ = 0;
  *(int *)&this->type = *(int *)&this->type + 1;
  local_38.structure.object = (Structure *)this;
  Value(__return_storage_ptr__,&local_38);
  RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_38.structure);
  getData(&local_50,__return_storage_ptr__);
  values.e = members.s;
  values.s = (Value *)s;
  PackedData::setFrom(&local_50,values);
  return __return_storage_ptr__;
}

Assistant:

Value Value::createStruct (Structure& s, ArrayView<Value> members)
{
    Value v (Type::createStruct (s));
    v.getData().setFrom (members);
    return v;
}